

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Message * __thiscall
google::protobuf::Reflection::GetDefaultMessageInstance(Reflection *this,FieldDescriptor *field)

{
  MessageFactory *pMVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar2;
  int iVar3;
  MessageFactory *pMVar4;
  OneofDescriptor *pOVar5;
  Descriptor *pDVar6;
  undefined4 extraout_var;
  Message *pMVar7;
  long *plVar8;
  undefined8 extraout_RDX;
  undefined4 extraout_var_00;
  
  pMVar1 = this->message_factory_;
  pMVar4 = MessageFactory::generated_factory();
  if (pMVar1 == pMVar4) {
    pMVar7 = (Message *)(field->field_22).default_value_int64_t_;
    if (pMVar7 == (Message *)0x0) {
      pMVar1 = this->message_factory_;
      pDVar6 = FieldDescriptor::message_type(field);
      iVar3 = (*pMVar1->_vptr_MessageFactory[2])(pMVar1,pDVar6);
      pMVar7 = (Message *)CONCAT44(extraout_var_00,iVar3);
      (field->field_22).default_value_int64_t_ = (int64_t)pMVar7;
    }
    return pMVar7;
  }
  if (((((field->field_0x1 & 8) == 0) && ((field->options_->field_0)._impl_.weak_ == false)) &&
      (bVar2 = IsLazyField(this,field), !bVar2)) &&
     (pOVar5 = FieldDescriptor::real_containing_oneof(field), pOVar5 == (OneofDescriptor *)0x0)) {
    plVar8 = (long *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
    if ((Message *)*plVar8 != (Message *)0x0) {
      return (Message *)*plVar8;
    }
  }
  pMVar1 = this->message_factory_;
  pDVar6 = FieldDescriptor::message_type(field);
  UNRECOVERED_JUMPTABLE = pMVar1->_vptr_MessageFactory[2];
  iVar3 = (*UNRECOVERED_JUMPTABLE)(pMVar1,pDVar6,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return (Message *)CONCAT44(extraout_var,iVar3);
}

Assistant:

const Message* Reflection::GetDefaultMessageInstance(
    const FieldDescriptor* field) const {
  // If we are using the generated factory, we cache the prototype in the field
  // descriptor for faster access.
  // The default instances of generated messages are not cross-linked, which
  // means they contain null pointers on their message fields and can't be used
  // to get the default of submessages.
  if (message_factory_ == MessageFactory::generated_factory()) {
    auto& ptr = field->default_generated_instance_;
    auto* res = ptr.load(std::memory_order_acquire);
    if (res == nullptr) {
      // First time asking for this field's default. Load it and cache it.
      res = message_factory_->GetPrototype(field->message_type());
      ptr.store(res, std::memory_order_release);
    }
    return res;
  }

  // For other factories, we try the default's object field.
  // In particular, the DynamicMessageFactory will cross link the default
  // instances to allow for this. But only do this for real fields.
  // This is an optimization to avoid going to GetPrototype() below, as that
  // requires a lock and a map lookup.
  if (!field->is_extension() && !field->options().weak() &&
      !IsLazyField(field) && !schema_.InRealOneof(field)) {
    auto* res = DefaultRaw<const Message*>(field);
    if (res != nullptr) {
      return res;
    }
  }
  // Otherwise, just go to the factory.
  return message_factory_->GetPrototype(field->message_type());
}